

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseDelphiCoverage::LoadCoverageData
          (cmParseDelphiCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  string path;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  lVar2 = (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::__cxx11::string::_M_assign((string *)&path);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Reading HTML File ");
    poVar1 = std::operator<<(poVar1,(string *)&path);
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                 ,0xd8,local_1c8[0],this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmsys::SystemTools::GetFilenameLastExtension((string *)&cmCTestLog_msg,&path);
    bVar3 = std::operator==((string *)&cmCTestLog_msg,".html");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar3) {
      ReadDelphiHTML(this,path._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::~string((string *)&path);
  return true;
}

Assistant:

cmParseDelphiCoverage::cmParseDelphiCoverage(
  cmCTestCoverageHandlerContainer& cont, cmCTest* ctest)
  : Coverage(cont)
  , CTest(ctest)
{
}